

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcb.c
# Opt level: O2

int envy_bios_parse_dcb(envy_bios *bios)

{
  uint8_t *res;
  ushort uVar1;
  envy_bios_dcb_entry *peVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  envy_bios_dcb_entry *peVar16;
  byte bVar17;
  byte bVar18;
  uint8_t uVar19;
  byte bVar20;
  char *__format;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  uint8_t defs;
  uint8_t dev_rec [7];
  byte abStack_37 [3];
  uint32_t sig;
  
  uVar1 = (bios->dcb).offset;
  if (uVar1 == 0) {
    return 0;
  }
  res = &(bios->dcb).version;
  iVar3 = bios_u8(bios,(uint)uVar1,res);
  if (iVar3 != 0) {
    return -0xe;
  }
  bVar18 = *res;
  uVar4 = 8;
  uVar5 = 4;
  switch(bVar18) {
  case 0x10:
  case 0x11:
    (bios->dcb).rlen = '\0';
    (bios->dcb).version = '\0';
    (bios->dcb).hlen = '\0';
    bios->odcb_offset = (uint)(bios->dcb).offset;
    (bios->dcb).offset = 0;
    return 0;
  case 0x12:
    (bios->dcb).hlen = '\x04';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\b';
    uVar6 = bios_u8(bios,(bios->dcb).offset + 1,&defs);
    uVar15 = bios_u16(bios,(bios->dcb).offset + 2,&(bios->i2c).offset);
    uVar15 = uVar15 | uVar6;
    (bios->i2c).def[0] = defs & 0xf;
    (bios->i2c).def[1] = defs >> 4;
    uVar6 = (bios->dcb).offset - 0x80;
    bios->odcb_offset = uVar6;
    envy_bios_block(bios,uVar6,0x80,"ODCB",-1);
    break;
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
switchD_00251ed5_caseD_13:
    uVar22 = (ulong)(bVar18 >> 4);
    uVar21 = (ulong)(bVar18 & 0xf);
    __format = "Unknown DCB table version %d.%d\n";
    goto LAB_00252824;
  case 0x14:
  case 0x15:
    (bios->dcb).hlen = '\x04';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\n';
    uVar4 = bios_u8(bios,(bios->dcb).offset + 1,&defs);
    uVar15 = bios_u16(bios,(bios->dcb).offset + 2,&(bios->i2c).offset);
    uVar15 = uVar15 | uVar4;
    (bios->i2c).def[0] = defs & 0xf;
    (bios->i2c).def[1] = defs >> 4;
    uVar4 = 10;
    break;
  case 0x20:
  case 0x21:
  case 0x22:
    (bios->dcb).hlen = '\b';
    (bios->dcb).entriesnum = '\x10';
    (bios->dcb).rlen = '\b';
    uVar5 = bios_u8(bios,(bios->dcb).offset + 1,&defs);
    uVar6 = bios_u16(bios,(bios->dcb).offset + 2,&(bios->i2c).offset);
    uVar15 = bios_u32(bios,(bios->dcb).offset + 4,&sig);
    if (sig == 0x4edcbdcb) {
      uVar15 = uVar6 | uVar5 | uVar15;
      (bios->i2c).def[0] = defs & 0xf;
      (bios->i2c).def[1] = defs >> 4;
      uVar5 = 8;
      break;
    }
LAB_00252666:
    fwrite("DCB sig mismatch\n",0x11,1,_stderr);
    goto LAB_0025282b;
  default:
    if ((0x11 < bVar18 - 0x30) || ((0x30001U >> (bVar18 - 0x30 & 0x1f) & 1) == 0))
    goto switchD_00251ed5_caseD_13;
    uVar4 = bios_u8(bios,(bios->dcb).offset + 1,&(bios->dcb).hlen);
    uVar5 = bios_u8(bios,(bios->dcb).offset + 2,&(bios->dcb).entriesnum);
    uVar6 = bios_u8(bios,(bios->dcb).offset + 3,&(bios->dcb).rlen);
    uVar7 = bios_u16(bios,(bios->dcb).offset + 4,&(bios->i2c).offset);
    uVar8 = bios_u32(bios,(bios->dcb).offset + 6,&sig);
    uVar9 = bios_u16(bios,(bios->dcb).offset + 10,&(bios->gpio).offset);
    uVar10 = bios_u16(bios,(bios->dcb).offset + 0xc,&(bios->inputdev).offset);
    uVar11 = bios_u16(bios,(bios->dcb).offset + 0xe,&(bios->cinema).offset);
    uVar12 = bios_u16(bios,(bios->dcb).offset + 0x10,&(bios->spreadspectrum).offset);
    uVar13 = bios_u16(bios,(bios->dcb).offset + 0x12,&(bios->extdev).offset);
    uVar14 = bios_u16(bios,(bios->dcb).offset + 0x14,&(bios->conn).offset);
    uVar15 = bios_u8(bios,(bios->dcb).offset + 0x16,&(bios->dcb).unk16);
    uVar15 = uVar15 | uVar14 | uVar13 | uVar12 | uVar11 |
                      uVar10 | uVar9 | uVar8 | uVar7 | uVar6 | uVar5 | uVar4;
    if ((bios->dcb).hlen < 0x19) {
      uVar5 = 0x17;
    }
    else {
      uVar4 = bios_u16(bios,(bios->dcb).offset + 0x17,&(bios->hdtvtt).offset);
      uVar15 = uVar15 | uVar4;
      if ((bios->dcb).hlen < 0x1b) {
        uVar5 = 0x19;
      }
      else {
        uVar4 = bios_u16(bios,(bios->dcb).offset + 0x19,&(bios->mux).offset);
        uVar15 = uVar15 | uVar4;
        uVar5 = 0x1b;
      }
    }
    uVar4 = 8;
    if (sig != 0x4edcbdcb) goto LAB_00252666;
  }
  envy_bios_block(bios,(uint)(bios->dcb).offset,
                  (uint)(bios->dcb).entriesnum * (uint)(bios->dcb).rlen + (uint)(bios->dcb).hlen,
                  "DCB",-1);
  if ((byte)((bios->dcb).version - 0x14) < 0x1c) {
    for (lVar23 = -7; lVar23 != 0; lVar23 = lVar23 + 1) {
      uVar6 = bios_u8(bios,(uint)(bios->dcb).offset + (int)lVar23,abStack_37 + lVar23);
      uVar15 = uVar15 | uVar6;
    }
    if ((uVar15 == 0) && (iVar3 = bcmp(dev_rec,"DEV_REC",7), iVar3 == 0)) {
      uVar1 = (bios->dcb).offset;
      uVar6 = uVar1 - 7;
      bios->dev_rec_offset = uVar6;
      bios->odcb_offset = uVar1 - 0x87;
      envy_bios_block(bios,uVar6,7,"DEV_REC",-1);
      envy_bios_block(bios,bios->odcb_offset,0x80,"ODCB",-1);
    }
    else {
      iVar3 = envy_bios_parse_rdcb(bios);
      if (iVar3 != 0) {
        bVar18 = (bios->dcb).rdcb_version;
        fprintf(_stderr,"Failed to parse RDCB table at 0x%04x version %d.%d\n",
                (ulong)(bios->dcb).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
      }
    }
  }
  iVar3 = -0xe;
  if (uVar15 == 0) {
    bVar18 = (bios->dcb).hlen;
    uVar6 = (uint)bVar18;
    if (bVar18 < uVar5) {
      __format = "DCB table header too short [%d < %d]\n";
      uVar22 = (ulong)uVar6;
      uVar21 = (ulong)uVar5;
    }
    else {
      bVar18 = (bios->dcb).rlen;
      uVar22 = (ulong)bVar18;
      if (uVar4 <= bVar18) {
        if (uVar5 < uVar6) {
          fprintf(_stderr,"DCB table header longer than expected [%d > %d]\n",(ulong)uVar6,
                  (ulong)uVar5);
          uVar22 = (ulong)(bios->dcb).rlen;
        }
        if (uVar4 < (uint)uVar22) {
          fprintf(_stderr,"DCB table record longer than expected [%d > %d]\n",uVar22,(ulong)uVar4);
        }
        bVar18 = (bios->dcb).entriesnum;
        peVar16 = (envy_bios_dcb_entry *)calloc((ulong)bVar18,0x20);
        (bios->dcb).entries = peVar16;
        if (peVar16 == (envy_bios_dcb_entry *)0x0) {
          return -0xc;
        }
        uVar21 = 0;
        do {
          if (bVar18 <= uVar21) {
            (bios->dcb).valid = '\x01';
            iVar3 = envy_bios_parse_i2c(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->i2c).version;
              fprintf(_stderr,"Failed to parse I2C table at 0x%04x version %d.%d\n",
                      (ulong)(bios->i2c).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_gpio(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->gpio).version;
              fprintf(_stderr,"Failed to parse GPIO table at 0x%04x version %d.%d\n",
                      (ulong)(bios->gpio).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_inputdev(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->inputdev).version;
              fprintf(_stderr,"Failed to parse INPUTDEV table at 0x%04x version %d.%d\n",
                      (ulong)(bios->inputdev).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_cinema(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->cinema).version;
              fprintf(_stderr,"Failed to parse CINEMA table at 0x%04x version %d.%d\n",
                      (ulong)(bios->cinema).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_spreadspectrum(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->spreadspectrum).version;
              fprintf(_stderr,"Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n",
                      (ulong)(bios->spreadspectrum).offset,(ulong)(bVar18 >> 4),
                      (ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_extdev(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->extdev).version;
              fprintf(_stderr,"Failed to parse EXTDEV table at 0x%04x version %d.%d\n",
                      (ulong)(bios->extdev).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_conn(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->conn).version;
              fprintf(_stderr,"Failed to parse CONN table at 0x%04x version %d.%d\n",
                      (ulong)(bios->conn).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_hdtvtt(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->hdtvtt).version;
              fprintf(_stderr,"Failed to parse HDTVTT table at 0x%04x version %d.%d\n",
                      (ulong)(bios->hdtvtt).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
            }
            iVar3 = envy_bios_parse_mux(bios);
            if (iVar3 != 0) {
              bVar18 = (bios->mux).version;
              fprintf(_stderr,"Failed to parse MUX table at 0x%04x version %d.%d\n",
                      (ulong)(bios->mux).offset,(ulong)(bVar18 >> 4),(ulong)(bVar18 & 0xf));
              return 0;
            }
            return 0;
          }
          peVar2 = (bios->dcb).entries;
          peVar16 = peVar2 + uVar21;
          peVar2[uVar21].offset =
               (ushort)(bios->dcb).rlen * (short)uVar21 +
               (ushort)(bios->dcb).hlen + (bios->dcb).offset;
          uVar22 = 0;
          while ((uVar22 != 10 && (uVar22 < (bios->dcb).rlen))) {
            iVar3 = bios_u8(bios,(uint)peVar16->offset + (int)uVar22,dev_rec + uVar22);
            uVar22 = uVar22 + 1;
            if (iVar3 != 0) {
              return -0xe;
            }
          }
          bVar18 = *res;
          if (bVar18 < 0x20) {
            if (0x13 < bVar18) {
              peVar16->type = dev_rec[0] & 0xf;
              peVar16->unk00_4 = dev_rec[0] >> 4;
              peVar16->i2c = dev_rec[2] * '\x04' & 0xf | dev_rec[1] >> 6;
              uVar19 = '\x01' << (dev_rec[2] >> 2 & 7);
              peVar16->or = uVar19;
              peVar16->heads = uVar19;
              peVar16->loc = dev_rec[2] >> 5;
              peVar16->conntag = dev_rec[3] >> 1 & 7;
              if ((dev_rec[0] & 0xf) == 0) {
                peVar16->maxfreq = (uint)stack0xffffffffffffffc8 * 10;
              }
            }
            goto switchD_002524aa_caseD_1;
          }
          peVar16->type = dev_rec[0] & 0xf;
          peVar16->i2c = dev_rec[0] >> 4;
          peVar16->heads = dev_rec[1] & 0xf;
          (&peVar16->conn)[(ulong)(bVar18 < 0x30) * 2] = dev_rec[1] >> 4;
          peVar16->conntag = dev_rec[2] & 0xf;
          peVar16->loc = dev_rec[2] >> 4 & 3;
          peVar16->unk02_6 = dev_rec[2] >> 6;
          peVar16->or = dev_rec[3] & 0xf;
          peVar16->unk03_4 = dev_rec[3] >> 4;
          peVar16->unk04 = dev_rec[4];
          peVar16->unk05 = dev_rec[5];
          peVar16->unk06 = dev_rec[6];
          peVar16->unk07 = abStack_37[0];
          bVar20 = dev_rec[4];
          switch(dev_rec[0] & 0xf) {
          case 0:
            if (bVar18 < 0x30) {
              peVar16->maxfreq = (uint)CONCAT11(dev_rec[5],dev_rec[4]) * 10;
              peVar16->unk04 = '\0';
              peVar16->unk05 = '\0';
            }
            else {
              peVar16->maxfreq = (uint)dev_rec[4] * 10000;
              peVar16->unk04 = '\0';
            }
            break;
          case 2:
            if (0x2f < bVar18) {
              peVar16->ext_addr = dev_rec[5];
              peVar16->unk05 = '\0';
              peVar16->tmds_hdmi = dev_rec[6] >> 1 & 1;
              bVar17 = dev_rec[6] & 0xfd;
              peVar16->unk06 = bVar17;
              goto LAB_002525da;
            }
            peVar16->ext_addr = dev_rec[4] >> 4;
            peVar16->unk04 = dev_rec[4] & 0xf;
            break;
          case 3:
            peVar16->lvds_info = dev_rec[4] & 3;
            peVar16->lvds_pscript = dev_rec[4] >> 2 & 3;
            peVar16->unk04 = dev_rec[4] & 0xf0;
            bVar20 = dev_rec[4] & 0xf0;
            bVar17 = dev_rec[6];
            goto LAB_002525da;
          case 6:
            peVar16->ext_addr = dev_rec[5];
            peVar16->unk05 = '\0';
            peVar16->dp_bw = dev_rec[6] >> 5;
            bVar17 = dev_rec[6] & 0x1f;
            peVar16->unk06 = bVar17;
            peVar16->dp_lanes = abStack_37[0] & 0xf;
            peVar16->unk07 = abStack_37[0] & 0xf0;
LAB_002525da:
            if (0x3f < bVar18) {
              peVar16->unk04 = bVar20 & 0xcf;
              peVar16->links = dev_rec[4] >> 4 & 3;
              peVar16->unk06 = bVar17 & 0xfd;
            }
          }
switchD_002524aa_caseD_1:
          uVar21 = uVar21 + 1;
          bVar18 = (bios->dcb).entriesnum;
        } while( true );
      }
      __format = "DCB table record too short [%d < %d]\n";
      uVar21 = (ulong)uVar4;
    }
LAB_00252824:
    fprintf(_stderr,__format,uVar22,uVar21);
LAB_0025282b:
    iVar3 = -0x16;
  }
  return iVar3;
}

Assistant:

int envy_bios_parse_dcb (struct envy_bios *bios) {
	struct envy_bios_dcb *dcb = &bios->dcb;
	if (!dcb->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, dcb->offset, &dcb->version);
	if (err)
		return -EFAULT;
	int wanthlen, wantrlen;
	uint32_t sig;
	uint8_t defs;
	switch (dcb->version) {
		case 0x10:
		case 0x11:
			/* old useless crap */
			wanthlen = dcb->hlen = 0;
			wantrlen = dcb->rlen = 0;
			dcb->version = 0;
			bios->odcb_offset = dcb->offset;
			dcb->offset = 0;
			return 0;
		case 0x12:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			bios->odcb_offset = dcb->offset - 0x80;
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
			break;
		case 0x14:
		case 0x15:
			wanthlen = dcb->hlen = 4;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 10;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x22:
		case 0x20:
		case 0x21:
			wanthlen = dcb->hlen = 8;
			dcb->entriesnum = 16;
			wantrlen = dcb->rlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &defs);
			err |= bios_u16(bios, dcb->offset+2, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+4, &sig);
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			bios->i2c.def[0] = defs & 0xf;
			bios->i2c.def[1] = defs >> 4;
			break;
		case 0x30:
		case 0x40:
		case 0x41:
			wanthlen = 23;
			wantrlen = 8;
			err |= bios_u8(bios, dcb->offset+1, &dcb->hlen);
			err |= bios_u8(bios, dcb->offset+2, &dcb->entriesnum);
			err |= bios_u8(bios, dcb->offset+3, &dcb->rlen);
			err |= bios_u16(bios, dcb->offset+4, &bios->i2c.offset);
			err |= bios_u32(bios, dcb->offset+6, &sig);
			err |= bios_u16(bios, dcb->offset+10, &bios->gpio.offset);
			err |= bios_u16(bios, dcb->offset+12, &bios->inputdev.offset);
			err |= bios_u16(bios, dcb->offset+14, &bios->cinema.offset);
			err |= bios_u16(bios, dcb->offset+16, &bios->spreadspectrum.offset);
			err |= bios_u16(bios, dcb->offset+18, &bios->extdev.offset);
			err |= bios_u16(bios, dcb->offset+20, &bios->conn.offset);
			err |= bios_u8(bios, dcb->offset+22, &dcb->unk16);
			if (dcb->hlen >= 25) {
				wanthlen = 25;
				err |= bios_u16(bios, dcb->offset+23, &bios->hdtvtt.offset);
			}
			if (dcb->hlen >= 27) {
				wanthlen = 27;
				err |= bios_u16(bios, dcb->offset+25, &bios->mux.offset);
			}
			if (sig != 0x4edcbdcb) {
				ENVY_BIOS_ERR("DCB sig mismatch\n");
				return -EINVAL;
			}
			break;
		default:
			ENVY_BIOS_ERR("Unknown DCB table version %d.%d\n", dcb->version >> 4, dcb->version & 0xf);
			return -EINVAL;
	}
	envy_bios_block(bios, dcb->offset, dcb->hlen + dcb->rlen * dcb->entriesnum, "DCB", -1);
	if (dcb->version >= 0x14 && dcb->version < 0x30) {
		uint8_t dev_rec[7];
		int j;
		for (j = 0; j < 7; j++)
			err |= bios_u8(bios, dcb->offset-7+j, &dev_rec[j]);
		if (!err && !memcmp(dev_rec, "DEV_REC", 7)) {
			bios->dev_rec_offset = dcb->offset - 7;
			bios->odcb_offset = bios->dev_rec_offset - 0x80;
			envy_bios_block(bios, bios->dev_rec_offset, 7, "DEV_REC", -1);
			envy_bios_block(bios, bios->odcb_offset, 0x80, "ODCB", -1);
		} else {
			if (envy_bios_parse_rdcb(bios))
				ENVY_BIOS_ERR("Failed to parse RDCB table at 0x%04x version %d.%d\n", bios->dcb.offset, bios->dcb.rdcb_version >> 4, bios->dcb.rdcb_version & 0xf);
		}
	}
	if (err)
		return -EFAULT;
	if (dcb->hlen < wanthlen) {
		ENVY_BIOS_ERR("DCB table header too short [%d < %d]\n", dcb->hlen, wanthlen);
		return -EINVAL;
	}
	if (dcb->rlen < wantrlen) {
		ENVY_BIOS_ERR("DCB table record too short [%d < %d]\n", dcb->rlen, wantrlen);
		return -EINVAL;
	}
	if (dcb->hlen > wanthlen) {
		ENVY_BIOS_WARN("DCB table header longer than expected [%d > %d]\n", dcb->hlen, wanthlen);
	}
	if (dcb->rlen > wantrlen) {
		ENVY_BIOS_WARN("DCB table record longer than expected [%d > %d]\n", dcb->rlen, wantrlen);
	}
	dcb->entries = calloc(dcb->entriesnum, sizeof *dcb->entries);
	if (!dcb->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < dcb->entriesnum; i++) {
		struct envy_bios_dcb_entry *entry = &dcb->entries[i];
		entry->offset = dcb->offset + dcb->hlen + dcb->rlen * i;
		uint8_t bytes[10];
		int j;
		for (j = 0; j < 10 && j < dcb->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
		}
		if (dcb->version >= 0x20) {
			entry->type = bytes[0] & 0xf;
			entry->i2c = bytes[0] >> 4;
			entry->heads = bytes[1] & 0xf;
			if (dcb->version >= 0x30)
				entry->conn = bytes[1] >> 4;
			else
				entry->unk01_4 = bytes[1] >> 4;
			entry->conntag = bytes[2] & 0xf;
			entry->loc = bytes[2] >> 4 & 3;
			entry->unk02_6 = bytes[2] >> 6;
			entry->or = bytes[3] & 0xf;
			entry->unk03_4 = bytes[3] >> 4; /* seen used once on quadro, not sure if it means something */
			entry->unk04 = bytes[4];
			entry->unk05 = bytes[5];
			entry->unk06 = bytes[6];
			entry->unk07 = bytes[7];
			switch (entry->type) {
				case ENVY_BIOS_DCB_ANALOG:
					if (dcb->version < 0x30) {
						entry->maxfreq = (bytes[4] | bytes[5] << 8) * 10;
						entry->unk04 = 0;
						entry->unk05 = 0;
					} else {
						entry->maxfreq = bytes[4] * 10000;
						entry->unk04 = 0;
					}
					break;
				case ENVY_BIOS_DCB_TMDS:
					if (dcb->version < 0x30) {
						entry->ext_addr = bytes[4] >> 4;
						entry->unk04 &= ~0xf0;
					} else {
						entry->ext_addr = bytes[5];
						entry->unk05 = 0;
						entry->tmds_hdmi = !!(bytes[6] & 2);
						entry->unk06 &= ~2;
					}
					break;
				case ENVY_BIOS_DCB_LVDS:
					entry->lvds_info = bytes[4] & 3;
					entry->lvds_pscript = bytes[4] >> 2 & 3;
					entry->unk04 &= ~0xf;
					break;
				case ENVY_BIOS_DCB_DP:
					entry->ext_addr = bytes[5];
					entry->unk05 = 0;
					entry->dp_bw = bytes[6] >> 5;
					entry->unk06 &= ~0xe0;
					entry->dp_lanes = bytes[7] & 0xf;
					entry->unk07 &= ~0xf;
					break;
				/* XXX: TV */
				default:
					break;
			}
			if ((entry->type == ENVY_BIOS_DCB_LVDS || entry->type == ENVY_BIOS_DCB_TMDS || entry->type == ENVY_BIOS_DCB_DP) && dcb->version >= 0x40) {
				entry->unk04 &= ~0x30;
				entry->links = bytes[4] >> 4 & 3;
				entry->unk06 &= ~2;
			}
		} else if (dcb->version >= 0x14) {
			entry->type = bytes[0] & 0xf;
			entry->unk00_4 = bytes[0] >> 4;
			entry->i2c = (bytes[1] >> 6 & 3) | (bytes[2] << 2 & 0xc);
			entry->heads = entry->or = 1 << (bytes[2] >> 2 & 7);
			entry->loc = (bytes[2] >> 5) | (bytes[3] << 3 & 1);
			entry->conntag = bytes[3] >> 1 & 7;
			if (entry->type == ENVY_BIOS_DCB_ANALOG)
				entry->maxfreq = (bytes[6] | bytes[7] << 8) * 10;
			/* XXX */
		} else {
			/* XXX */
		}
	}
	dcb->valid = 1;
	if (envy_bios_parse_i2c(bios))
		ENVY_BIOS_ERR("Failed to parse I2C table at 0x%04x version %d.%d\n", bios->i2c.offset, bios->i2c.version >> 4, bios->i2c.version & 0xf);
	if (envy_bios_parse_gpio(bios))
		ENVY_BIOS_ERR("Failed to parse GPIO table at 0x%04x version %d.%d\n", bios->gpio.offset, bios->gpio.version >> 4, bios->gpio.version & 0xf);
	if (envy_bios_parse_inputdev(bios))
		ENVY_BIOS_ERR("Failed to parse INPUTDEV table at 0x%04x version %d.%d\n", bios->inputdev.offset, bios->inputdev.version >> 4, bios->inputdev.version & 0xf);
	if (envy_bios_parse_cinema(bios))
		ENVY_BIOS_ERR("Failed to parse CINEMA table at 0x%04x version %d.%d\n", bios->cinema.offset, bios->cinema.version >> 4, bios->cinema.version & 0xf);
	if (envy_bios_parse_spreadspectrum(bios))
		ENVY_BIOS_ERR("Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n", bios->spreadspectrum.offset, bios->spreadspectrum.version >> 4, bios->spreadspectrum.version & 0xf);
	if (envy_bios_parse_extdev(bios))
		ENVY_BIOS_ERR("Failed to parse EXTDEV table at 0x%04x version %d.%d\n", bios->extdev.offset, bios->extdev.version >> 4, bios->extdev.version & 0xf);
	if (envy_bios_parse_conn(bios))
		ENVY_BIOS_ERR("Failed to parse CONN table at 0x%04x version %d.%d\n", bios->conn.offset, bios->conn.version >> 4, bios->conn.version & 0xf);
	if (envy_bios_parse_hdtvtt(bios))
		ENVY_BIOS_ERR("Failed to parse HDTVTT table at 0x%04x version %d.%d\n", bios->hdtvtt.offset, bios->hdtvtt.version >> 4, bios->hdtvtt.version & 0xf);
	if (envy_bios_parse_mux(bios))
		ENVY_BIOS_ERR("Failed to parse MUX table at 0x%04x version %d.%d\n", bios->mux.offset, bios->mux.version >> 4, bios->mux.version & 0xf);
	return 0;
}